

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_td(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  _Bool _Var1;
  TCGv_i32 arg4;
  uintptr_t o;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  _Var1 = check_unconditional_trap(ctx);
  if (_Var1) {
    return;
  }
  arg4 = tcg_const_i32_ppc64(tcg_ctx,ctx->opcode >> 0x15 & 0x1f);
  gen_helper_td(tcg_ctx,tcg_ctx->cpu_env,
                *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0xd & 0xf8)),
                *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 8 & 0xf8)),arg4);
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(arg4 + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_td(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 t0;

    if (check_unconditional_trap(ctx)) {
        return;
    }
    t0 = tcg_const_i32(tcg_ctx, TO(ctx->opcode));
    gen_helper_td(tcg_ctx, tcg_ctx->cpu_env, cpu_gpr[rA(ctx->opcode)], cpu_gpr[rB(ctx->opcode)],
                  t0);
    tcg_temp_free_i32(tcg_ctx, t0);
}